

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O3

uint32_t __thiscall cfd::core::SigHashType::GetSigHashFlag(SigHashType *this)

{
  SigHashAlgorithm SVar1;
  SigHashAlgorithm SVar2;
  
  SVar2 = (SigHashAlgorithm)this->kSigHashAnyOneCanPay;
  if (this->is_anyone_can_pay_ == false) {
    SVar2 = kSigHashDefault;
  }
  SVar1 = (SigHashAlgorithm)this->kSigHashForkId;
  if (this->is_fork_id_ == false) {
    SVar1 = kSigHashDefault;
  }
  return SVar1 | SVar2 | this->hash_algorithm_;
}

Assistant:

uint32_t SigHashType::GetSigHashFlag() const {
  uint32_t flag = hash_algorithm_;
  if (is_anyone_can_pay_) {
    flag |= kSigHashAnyOneCanPay;
  }
  if (is_fork_id_) {
    flag |= kSigHashForkId;
  }
  return flag;
}